

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inversion.cpp
# Opt level: O0

void __thiscall OpenMD::Inversion::calcForce(Inversion *this,RealType *angle,bool doParticlePot)

{
  byte in_DL;
  double *in_RSI;
  long in_RDI;
  double dVar1;
  Vector3d dcosdB;
  Vector3d dcosdA;
  Vector3d f3;
  Vector3d f2;
  Vector3d f1;
  RealType sin_phi;
  RealType dVdPhi;
  RealType phi;
  RealType dVdcosPhi;
  RealType cos_phi;
  RealType rB;
  Vector3d B;
  RealType rA;
  Vector3d A;
  Vector3d r43;
  Vector3d r23;
  Vector3d r31;
  Vector3d pos4;
  Vector3d pos3;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> *in_stack_fffffffffffffbd8;
  Vector<double,_3U> *in_stack_fffffffffffffbe0;
  StuntDouble *v1;
  StuntDouble *in_stack_fffffffffffffbe8;
  StuntDouble *v1_00;
  Vector<double,_3U> *in_stack_fffffffffffffbf0;
  StuntDouble *this_00;
  Vector3<double> *in_stack_fffffffffffffc40;
  Vector3<double> *in_stack_fffffffffffffc48;
  Vector3d *in_stack_fffffffffffffc58;
  Snapshot *in_stack_fffffffffffffc60;
  double local_170;
  double local_168;
  double local_160;
  StuntDouble *local_158;
  double local_150;
  double local_148;
  double local_128;
  byte local_11;
  double *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),1);
  StuntDouble::getPos(in_stack_fffffffffffffbe8);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),2);
  StuntDouble::getPos(in_stack_fffffffffffffbe8);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),0);
  StuntDouble::getPos(in_stack_fffffffffffffbe8);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),3);
  StuntDouble::getPos(in_stack_fffffffffffffbe8);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 8));
  Snapshot::wrapVector(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 8));
  Snapshot::wrapVector(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 8));
  Snapshot::wrapVector(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  cross<double>(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  local_128 = Vector<double,_3U>::length((Vector<double,_3U> *)0x27266f);
  cross<double>(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  local_148 = Vector<double,_3U>::length((Vector<double,_3U> *)0x2726a2);
  Vector<double,_3U>::normalize(in_stack_fffffffffffffbe0);
  Vector<double,_3U>::normalize(in_stack_fffffffffffffbe0);
  local_150 = dot<double,3u>(in_stack_fffffffffffffbf0,
                             (Vector<double,_3U> *)in_stack_fffffffffffffbe8);
  if (1.0 < local_150) {
    local_150 = 1.0;
  }
  if (local_150 < -1.0) {
    local_150 = -1.0;
  }
  if (*(int *)(in_RDI + 0x70) == 0) {
    local_160 = acos(local_150);
    (**(code **)(**(long **)(in_RDI + 0x68) + 0x10))
              (local_160,*(long **)(in_RDI + 0x68),in_RDI + 0x98,&local_168);
    local_170 = sqrt(-local_150 * local_150 + 1.0);
    if (ABS(local_170) < 1e-06) {
      local_170 = 1e-06;
    }
    local_158 = (StuntDouble *)(-local_168 / local_170);
  }
  else if (*(int *)(in_RDI + 0x70) == 1) {
    (**(code **)(**(long **)(in_RDI + 0x68) + 0x10))
              (local_150,*(long **)(in_RDI + 0x68),in_RDI + 0x98,&local_158);
  }
  Vector3<double>::Vector3((Vector3<double> *)0x272873);
  Vector3<double>::Vector3((Vector3<double> *)0x272880);
  Vector3<double>::Vector3((Vector3<double> *)0x27288d);
  OpenMD::operator*((double)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  operator/((Vector<double,_3U> *)in_stack_fffffffffffffbe8,(double)in_stack_fffffffffffffbe0);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  OpenMD::operator*((double)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  operator/((Vector<double,_3U> *)in_stack_fffffffffffffbe8,(double)in_stack_fffffffffffffbe0);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  v1 = local_158;
  cross<double>(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator*((double)in_stack_fffffffffffffbe8,(Vector<double,_3U> *)v1);
  Vector3<double>::operator=((Vector3<double> *)in_stack_fffffffffffffbe8,(Vector<double,_3U> *)v1);
  v1_00 = local_158;
  cross<double>(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  cross<double>(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator-((Vector<double,_3U> *)v1_00,(Vector<double,_3U> *)v1);
  OpenMD::operator*((double)v1_00,(Vector<double,_3U> *)v1);
  Vector3<double>::operator=((Vector3<double> *)v1_00,(Vector<double,_3U> *)v1);
  this_00 = local_158;
  cross<double>(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  OpenMD::operator*((double)v1_00,(Vector<double,_3U> *)v1);
  Vector3<double>::operator=((Vector3<double> *)v1_00,(Vector<double,_3U> *)v1);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),1);
  StuntDouble::addFrc(this_00,(Vector3d *)v1_00);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),0);
  OpenMD::operator-((Vector<double,_3U> *)v1_00,(Vector<double,_3U> *)v1);
  OpenMD::operator+((Vector<double,_3U> *)v1_00,(Vector<double,_3U> *)v1);
  Vector3<double>::Vector3((Vector3<double> *)v1,in_stack_fffffffffffffbd8);
  StuntDouble::addFrc(this_00,(Vector3d *)v1_00);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),3);
  OpenMD::operator-((Vector<double,_3U> *)v1_00);
  Vector3<double>::Vector3((Vector3<double> *)v1,in_stack_fffffffffffffbd8);
  StuntDouble::addFrc(this_00,(Vector3d *)v1_00);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),2);
  OpenMD::operator-((Vector<double,_3U> *)v1_00);
  Vector3<double>::Vector3((Vector3<double> *)v1,in_stack_fffffffffffffbd8);
  StuntDouble::addFrc(this_00,(Vector3d *)v1_00);
  if ((local_11 & 1) != 0) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),0);
    StuntDouble::addParticlePot(this_00,(RealType *)v1_00);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),1);
    StuntDouble::addParticlePot(this_00,(RealType *)v1_00);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),2);
    StuntDouble::addParticlePot(this_00,(RealType *)v1_00);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),3);
    StuntDouble::addParticlePot(this_00,(RealType *)v1_00);
  }
  dVar1 = acos(local_150);
  *local_10 = (dVar1 / 3.141592653589793) * 180.0;
  return;
}

Assistant:

void Inversion::calcForce(RealType& angle, bool doParticlePot) {
    // In OpenMD's version of an inversion, the central atom
    // comes first.  However, to get the planarity in a typical cosine
    // version of this potential (i.e. Amber-style), the central atom
    // is treated as atom *3* in a standard torsion form:

    Vector3d pos1 = atoms_[1]->getPos();
    Vector3d pos2 = atoms_[2]->getPos();
    Vector3d pos3 = atoms_[0]->getPos();
    Vector3d pos4 = atoms_[3]->getPos();

    Vector3d r31 = pos1 - pos3;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r31);
    Vector3d r23 = pos3 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r23);
    Vector3d r43 = pos3 - pos4;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r43);

    //  Calculate the cross products and distances
    Vector3d A  = cross(r31, r43);
    RealType rA = A.length();
    Vector3d B  = cross(r43, r23);
    RealType rB = B.length();

    A.normalize();
    B.normalize();

    //  Calculate the sin and cos
    RealType cos_phi = dot(A, B);
    if (cos_phi > 1.0) cos_phi = 1.0;
    if (cos_phi < -1.0) cos_phi = -1.0;

    RealType dVdcosPhi;
    switch (inversionKey_) {
    case itCosAngle:
      inversionType_->calcForce(cos_phi, potential_, dVdcosPhi);
      break;
    case itAngle:
      RealType phi = acos(cos_phi);
      RealType dVdPhi;
      inversionType_->calcForce(phi, potential_, dVdPhi);
      RealType sin_phi = sqrt(1.0 - cos_phi * cos_phi);
      if (fabs(sin_phi) < 1.0E-6) { sin_phi = 1.0E-6; }
      dVdcosPhi = -dVdPhi / sin_phi;

      break;
    }

    Vector3d f1;
    Vector3d f2;
    Vector3d f3;

    Vector3d dcosdA = (cos_phi * A - B) / rA;
    Vector3d dcosdB = (cos_phi * B - A) / rB;

    f1 = dVdcosPhi * cross(r43, dcosdA);
    f2 = dVdcosPhi * (cross(r23, dcosdB) - cross(r31, dcosdA));
    f3 = dVdcosPhi * cross(dcosdB, r43);

    // In OpenMD's version of an improper torsion, the central atom
    // comes first.  However, to get the planarity in a typical cosine
    // version of this potential (i.e. Amber-style), the central atom
    // is treated as atom *3* in a standard torsion form:

    //  AMBER:   I - J - K - L   (e.g. K is sp2 hybridized carbon)
    //  OpenMD:  I - (J - K - L)  (e.g. I is sp2 hybridized carbon)

    // Confusing enough?  Good.

    atoms_[1]->addFrc(f1);
    atoms_[0]->addFrc(f2 - f1 + f3);
    atoms_[3]->addFrc(-f2);
    atoms_[2]->addFrc(-f3);

    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      atoms_[1]->addParticlePot(potential_);
      atoms_[2]->addParticlePot(potential_);
      atoms_[3]->addParticlePot(potential_);
    }

    angle = acos(cos_phi) / Constants::PI * 180.0;
  }